

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion-bignum.cpp
# Opt level: O1

int icu_63::double_conversion::Bignum::PlusCompare(Bignum *a,Bignum *b,Bignum *c)

{
  long lVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  uint *puVar9;
  int iVar10;
  Bignum *pBVar11;
  long lVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  long lVar22;
  int local_44;
  
  do {
    pBVar11 = a;
    a = b;
    iVar2 = pBVar11->exponent_;
    lVar12 = (long)iVar2;
    lVar8 = pBVar11->used_digits_ + lVar12;
    iVar10 = a->exponent_;
    lVar15 = (long)iVar10;
    lVar14 = a->used_digits_ + lVar15;
    iVar7 = (int)lVar8;
    iVar13 = (int)lVar14;
    b = pBVar11;
  } while (iVar7 < iVar13);
  iVar3 = c->exponent_;
  lVar1 = (long)iVar3 + (long)c->used_digits_;
  iVar16 = (int)lVar1;
  iVar6 = -1;
  if (((iVar16 <= iVar7 + 1) && (iVar6 = 1, iVar7 <= iVar16)) &&
     ((iVar2 < iVar13 || (iVar6 = -1, iVar16 <= iVar7)))) {
    if (iVar2 < iVar10) {
      iVar10 = iVar2;
    }
    if (iVar3 <= iVar10) {
      iVar10 = iVar3;
    }
    puVar9 = (c->bigits_).start_ + c->used_digits_;
    uVar21 = 0;
    lVar5 = lVar1;
    do {
      lVar22 = lVar5;
      puVar9 = puVar9 + -1;
      if (lVar22 <= iVar10) break;
      uVar18 = 0;
      if ((lVar12 < lVar22) && (lVar22 <= lVar8)) {
        uVar18 = (pBVar11->bigits_).start_[(lVar22 + -1) - lVar12];
      }
      uVar17 = 0;
      if ((lVar15 < lVar22) && (uVar17 = 0, lVar22 <= lVar14)) {
        uVar17 = (a->bigits_).start_[(lVar22 + -1) - lVar15];
      }
      uVar19 = 0;
      if (iVar3 < lVar22 && lVar22 <= lVar1) {
        uVar19 = *puVar9;
      }
      uVar20 = (uVar19 + uVar21) - (uVar17 + uVar18);
      if (uVar19 + uVar21 < uVar17 + uVar18) {
        local_44 = 1;
        bVar4 = false;
      }
      else {
        bVar4 = uVar20 < 2;
        if (bVar4) {
          uVar21 = uVar20 * 0x10000000;
        }
        else {
          local_44 = -1;
          uVar21 = uVar20;
        }
      }
      lVar5 = lVar22 + -1;
    } while (bVar4);
    iVar6 = -(uint)(uVar21 != 0);
    if (iVar10 < lVar22) {
      iVar6 = local_44;
    }
  }
  return iVar6;
}

Assistant:

int Bignum::PlusCompare(const Bignum& a, const Bignum& b, const Bignum& c) {
  ASSERT(a.IsClamped());
  ASSERT(b.IsClamped());
  ASSERT(c.IsClamped());
  if (a.BigitLength() < b.BigitLength()) {
    return PlusCompare(b, a, c);
  }
  if (a.BigitLength() + 1 < c.BigitLength()) return -1;
  if (a.BigitLength() > c.BigitLength()) return +1;
  // The exponent encodes 0-bigits. So if there are more 0-digits in 'a' than
  // 'b' has digits, then the bigit-length of 'a'+'b' must be equal to the one
  // of 'a'.
  if (a.exponent_ >= b.BigitLength() && a.BigitLength() < c.BigitLength()) {
    return -1;
  }

  Chunk borrow = 0;
  // Starting at min_exponent all digits are == 0. So no need to compare them.
  int min_exponent = Min(Min(a.exponent_, b.exponent_), c.exponent_);
  for (int i = c.BigitLength() - 1; i >= min_exponent; --i) {
    Chunk chunk_a = a.BigitAt(i);
    Chunk chunk_b = b.BigitAt(i);
    Chunk chunk_c = c.BigitAt(i);
    Chunk sum = chunk_a + chunk_b;
    if (sum > chunk_c + borrow) {
      return +1;
    } else {
      borrow = chunk_c + borrow - sum;
      if (borrow > 1) return -1;
      borrow <<= kBigitSize;
    }
  }
  if (borrow == 0) return 0;
  return -1;
}